

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

void cmd_release(command_conflict *cmd)

{
  char *pcVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 0x28) {
    if (*(int *)(cmd->arg[0].name + lVar2 + -0x10) == 1) {
      string_free(*(char **)(cmd->arg[0].name + lVar2 + -8));
      cmd->arg[0].name[lVar2] = '\0';
      pcVar1 = cmd->arg[0].name + lVar2 + -0x10;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
    }
  }
  return;
}

Assistant:

void cmd_release(struct command *cmd)
{
	int i;

	for (i = 0; i < CMD_MAX_ARGS; ++i) {
		if (cmd->arg[i].type == arg_STRING) {
			string_free((char*)(cmd->arg[i].data.string));
			cmd->arg[i].name[0] = '\0';
			cmd->arg[i].type = arg_NONE;
		}
	}
}